

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O0

int Llb_ManComputeCommonQuant(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  int local_20;
  int local_1c;
  int Weight;
  int iVar;
  int iCol2_local;
  int iCol1_local;
  Llb_Mtr_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < p->nRows - p->nFfs; local_1c = local_1c + 1) {
    if (((p->pMatrix[iCol1][local_1c] == '\x01') && (p->pMatrix[iCol2][local_1c] == '\x01')) &&
       (p->pRowSums[local_1c] == 2)) {
      local_20 = local_20 + 2;
    }
    else if (((p->pMatrix[iCol1][local_1c] == '\x01') && (p->pMatrix[iCol2][local_1c] == '\0')) ||
            ((p->pMatrix[iCol1][local_1c] == '\0' && (p->pMatrix[iCol2][local_1c] == '\x01')))) {
      local_20 = local_20 + -1;
    }
  }
  return local_20;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManComputeCommonQuant( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    int iVar, Weight = 0;
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    {
        // count each removed variable as 2
        if ( p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 1 && p->pRowSums[iVar] == 2 )
            Weight += 2;
        // count each added variale as -1
        else if ( (p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 0) || 
                  (p->pMatrix[iCol1][iVar] == 0 && p->pMatrix[iCol2][iVar] == 1) )
            Weight--;
    }
    return Weight;
}